

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_handle_lifetime.cpp
# Opt level: O0

ze_result_t __thiscall
validation_layer::ZESHandleLifetimeValidation::zesFabricPortGetMultiPortThroughputPrologue
          (ZESHandleLifetimeValidation *this,zes_device_handle_t hDevice,uint32_t numPorts,
          zes_fabric_port_handle_t *phPort,zes_fabric_port_throughput_t **pThroughput)

{
  bool bVar1;
  pointer pHVar2;
  ulong local_40;
  size_t i;
  zes_fabric_port_throughput_t **pThroughput_local;
  zes_fabric_port_handle_t *phPort_local;
  uint32_t numPorts_local;
  zes_device_handle_t hDevice_local;
  ZESHandleLifetimeValidation *this_local;
  
  pHVar2 = std::
           unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
           ::operator->((unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
                         *)(context + 0xd48));
  bVar1 = HandleLifetimeValidation::isHandleValid(pHVar2,hDevice);
  if (bVar1) {
    for (local_40 = 0; phPort != (zes_fabric_port_handle_t *)0x0 && local_40 < numPorts;
        local_40 = local_40 + 1) {
      pHVar2 = std::
               unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
               ::operator->((unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
                             *)(context + 0xd48));
      bVar1 = HandleLifetimeValidation::isHandleValid(pHVar2,phPort[local_40]);
      if (!bVar1) {
        return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
      }
    }
    this_local._4_4_ = ZE_RESULT_SUCCESS;
  }
  else {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  return this_local._4_4_;
}

Assistant:

ze_result_t
    ZESHandleLifetimeValidation::zesFabricPortGetMultiPortThroughputPrologue(
        zes_device_handle_t hDevice,                    ///< [in] Sysman handle of the device.
        uint32_t numPorts,                              ///< [in] Number of ports enumerated in function ::zesDeviceEnumFabricPorts
        zes_fabric_port_handle_t* phPort,               ///< [in][range(0, numPorts)] array of fabric port handles provided by user
                                                        ///< to gather throughput values. 
        zes_fabric_port_throughput_t** pThroughput      ///< [out][range(0, numPorts)] array of fabric port throughput counters
                                                        ///< from multiple ports of type ::zes_fabric_port_throughput_t.
        )
    { 
        
        if ( !context.handleLifetime->isHandleValid( hDevice )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        for (size_t i = 0; ( nullptr != phPort) && (i < numPorts); ++i){
            if (!context.handleLifetime->isHandleValid( phPort[i] )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
            }
        }
        return ZE_RESULT_SUCCESS;
    }